

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

string * __thiscall
t_cpp_generator::render_const_value
          (string *__return_storage_ptr__,t_cpp_generator *this,ostream *out,string name,
          t_type *type,t_const_value *value)

{
  uint uVar1;
  char cVar2;
  t_const_value_type tVar3;
  ostream *poVar4;
  int64_t iVar5;
  ostringstream *this_00;
  char *pcVar6;
  t_const_value *in_R9;
  undefined1 auVar7 [12];
  string t;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream render;
  
  this_00 = (ostringstream *)&render;
  std::__cxx11::ostringstream::ostringstream(this_00);
  cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x28))(value);
  if (cVar2 == '\0') {
    cVar2 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x50))(value);
    if (cVar2 == '\0') {
      std::__cxx11::string::string((string *)&local_1c8,"tmp",(allocator *)&local_208);
      t_generator::tmp(&t,(t_generator *)this,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      poVar4 = t_generator::indent((t_generator *)this,out);
      type_name_abi_cxx11_(&local_208,this,(t_type *)value,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_208);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)&t);
      poVar4 = std::operator<<(poVar4,";");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string((string *)&local_1e8,(string *)&t);
      print_const_value(this,out,&local_1e8,(t_type *)value,in_R9);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&t);
    }
    else {
      poVar4 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,"(");
      type_name_abi_cxx11_(&t,this,(t_type *)value,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&t);
      poVar4 = std::operator<<(poVar4,")");
      t_const_value::get_integer(in_R9);
      std::ostream::_M_insert<long>((long)poVar4);
    }
    goto LAB_0016dae0;
  }
  uVar1 = *(uint *)&(value->identifierVal_).field_2;
  switch(uVar1) {
  case 1:
    poVar4 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,'\"');
    t_generator::get_escaped_string_abi_cxx11_(&t,(t_generator *)this,in_R9);
    poVar4 = std::operator<<(poVar4,(string *)&t);
    std::operator<<(poVar4,'\"');
    break;
  case 2:
    iVar5 = t_const_value::get_integer(in_R9);
    pcVar6 = "false";
    if (0 < iVar5) {
      pcVar6 = "true";
    }
    goto LAB_0016db1e;
  case 3:
  case 4:
  case 5:
    t_const_value::get_integer(in_R9);
    std::ostream::_M_insert<long>((long)&render);
    goto LAB_0016db26;
  case 6:
    t_const_value::get_integer(in_R9);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)&render);
    pcVar6 = "LL";
LAB_0016db1e:
    std::operator<<((ostream *)this_00,pcVar6);
    goto LAB_0016db26;
  case 7:
    tVar3 = t_const_value::get_type(in_R9);
    if (tVar3 == CV_INTEGER) {
      poVar4 = std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,
                               "static_cast<double>(");
      t_const_value::get_integer(in_R9);
      this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)poVar4);
      pcVar6 = ")";
      goto LAB_0016db1e;
    }
    t_generator::emit_double_as_string_abi_cxx11_(&t,(t_generator *)this,in_R9->doubleVal_);
    std::operator<<(&render.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&t);
    break;
  default:
    auVar7 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&t,(t_base_type *)(ulong)uVar1,auVar7._8_4_);
    std::operator+(auVar7._0_8_,"compiler error: no const of base type ",&t);
    __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
LAB_0016dae0:
  std::__cxx11::string::~string((string *)&t);
LAB_0016db26:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&render);
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::render_const_value(ostream& out,
                                           string name,
                                           t_type* type,
                                           t_const_value* value) {
  (void)name;
  std::ostringstream render;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      render << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      render << ((value->get_integer() > 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      render << value->get_integer();
      break;
    case t_base_type::TYPE_I64:
      render << value->get_integer() << "LL";
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        render << "static_cast<double>(" << value->get_integer() << ")";
      } else {
        render << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    render << "(" << type_name(type) << ")" << value->get_integer();
  } else {
    string t = tmp("tmp");
    indent(out) << type_name(type) << " " << t << ";" << endl;
    print_const_value(out, t, type, value);
    render << t;
  }

  return render.str();
}